

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O3

REF_STATUS ref_recon_max_jump_limit(REF_DBL *recon,REF_GRID ref_grid,REF_DBL max_jump)

{
  undefined1 auVar1 [16];
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  REF_DBL *pRVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  REF_NODE ref_node;
  double dVar9;
  double dVar10;
  double dVar11;
  REF_INT nnode;
  REF_INT node_list [1000];
  int local_107c;
  REF_DBL *local_1078;
  REF_CELL local_1070;
  REF_NODE local_1068;
  double local_1060;
  double local_1058;
  double local_1048;
  undefined1 local_1038 [16];
  double local_1028;
  REF_INT local_fd8 [1002];
  
  ref_node = ref_grid->node;
  if (ref_grid->twod == 0) {
    local_1070 = ref_grid->cell[8];
  }
  else {
    local_1070 = ref_grid->cell[3];
  }
  local_1078 = recon;
  if (0 < ref_node->max) {
    local_1058 = max_jump * 4.0;
    local_1048 = local_1058;
    if (local_1058 <= -local_1058) {
      local_1048 = -local_1058;
    }
    lVar8 = 0;
    local_1068 = ref_node;
    do {
      if (-1 < ref_node->global[lVar8]) {
        uVar2 = ref_cell_node_list_around(local_1070,(REF_INT)lVar8,1000,&local_107c,local_fd8);
        if (uVar2 != 0) {
          pcVar7 = "first halo of nodes";
          uVar4 = 0x517;
          goto LAB_001bb735;
        }
        if ((long)local_107c < 1) {
          dVar10 = 0.0;
        }
        else {
          pRVar5 = ref_node->real;
          dVar10 = 0.0;
          lVar3 = 0;
          do {
            lVar6 = (long)local_fd8[lVar3];
            dVar11 = SQRT((pRVar5[lVar6 * 0xf + 2] - pRVar5[lVar8 * 0xf + 2]) *
                          (pRVar5[lVar6 * 0xf + 2] - pRVar5[lVar8 * 0xf + 2]) +
                          (pRVar5[lVar6 * 0xf + 1] - pRVar5[lVar8 * 0xf + 1]) *
                          (pRVar5[lVar6 * 0xf + 1] - pRVar5[lVar8 * 0xf + 1]) +
                          (pRVar5[lVar6 * 0xf] - pRVar5[lVar8 * 0xf]) *
                          (pRVar5[lVar6 * 0xf] - pRVar5[lVar8 * 0xf]));
            dVar9 = dVar11;
            if (lVar3 != 0) {
              dVar9 = dVar10;
            }
            dVar10 = dVar9;
            if (dVar11 <= dVar9) {
              dVar10 = dVar11;
            }
            lVar3 = lVar3 + 1;
          } while (local_107c != lVar3);
        }
        dVar9 = dVar10 * 1e+20 * dVar10;
        if (dVar9 <= -dVar9) {
          dVar9 = -dVar9;
        }
        if (local_1048 < dVar9) {
          pRVar5 = local_1078 + lVar8 * 6;
          local_1060 = dVar10;
          uVar2 = ref_matrix_diag_m(pRVar5,(REF_DBL *)local_1038);
          if (uVar2 != 0) {
            pcVar7 = "eigen decomp";
            uVar4 = 0x52a;
            goto LAB_001bb735;
          }
          dVar10 = local_1058 / (local_1060 * local_1060);
          auVar1._8_8_ = dVar10;
          auVar1._0_8_ = dVar10;
          local_1038 = minpd(local_1038,auVar1);
          if (dVar10 <= local_1028) {
            local_1028 = dVar10;
          }
          uVar2 = ref_matrix_form_m((REF_DBL *)local_1038,pRVar5);
          ref_node = local_1068;
          if (uVar2 != 0) {
            pcVar7 = "re-form hess";
            uVar4 = 0x531;
            goto LAB_001bb735;
          }
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < ref_node->max);
  }
  uVar2 = ref_node_ghost_dbl(ref_node,local_1078,6);
  if (uVar2 == 0) {
    uVar2 = 0;
  }
  else {
    pcVar7 = "update ghosts";
    uVar4 = 0x535;
LAB_001bb735:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar4,
           "ref_recon_max_jump_limit",(ulong)uVar2,pcVar7);
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_recon_max_jump_limit(REF_DBL *recon, REF_GRID ref_grid,
                                            REF_DBL max_jump) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT i, node;
  REF_DBL radius, dist;
  REF_DBL eig_ceiling;
  REF_INT nnode, node_list[REF_RECON_MAX_DEGREE],
      max_node = REF_RECON_MAX_DEGREE;
  REF_DBL diag_system[12];

  if (ref_grid_twod(ref_grid)) ref_cell = ref_grid_tri(ref_grid);

  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_cell_node_list_around(ref_cell, node, max_node, &nnode, node_list),
        "first halo of nodes");
    radius = 0.0;
    for (i = 0; i < nnode; i++) {
      dist = sqrt(pow(ref_node_xyz(ref_node, 0, node_list[i]) -
                          ref_node_xyz(ref_node, 0, node),
                      2) +
                  pow(ref_node_xyz(ref_node, 1, node_list[i]) -
                          ref_node_xyz(ref_node, 1, node),
                      2) +
                  pow(ref_node_xyz(ref_node, 2, node_list[i]) -
                          ref_node_xyz(ref_node, 2, node),
                      2));
      if (i == 0) radius = dist;
      radius = MIN(radius, dist);
    }
    /* 2nd order central finite difference */
    if (ref_math_divisible(4 * max_jump, radius * radius)) {
      eig_ceiling = (4 * max_jump) / (radius * radius);

      RSS(ref_matrix_diag_m(&(recon[6 * node]), diag_system), "eigen decomp");
      ref_matrix_eig(diag_system, 0) =
          MIN(ref_matrix_eig(diag_system, 0), eig_ceiling);
      ref_matrix_eig(diag_system, 1) =
          MIN(ref_matrix_eig(diag_system, 1), eig_ceiling);
      ref_matrix_eig(diag_system, 2) =
          MIN(ref_matrix_eig(diag_system, 2), eig_ceiling);
      RSS(ref_matrix_form_m(diag_system, &(recon[6 * node])), "re-form hess");
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, recon, 6), "update ghosts");

  return REF_SUCCESS;
}